

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

bool __thiscall NaStateSpaceModel::Empty(NaStateSpaceModel *this)

{
  uint uVar1;
  long in_RDI;
  NaReal NVar2;
  uint7 in_stack_fffffffffffffff0;
  bool bVar3;
  
  uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x50));
  bVar3 = false;
  if (uVar1 == 1) {
    uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x50));
    bVar3 = false;
    if (uVar1 == 1) {
      NVar2 = NaMatrix::get((NaMatrix *)(ulong)in_stack_fffffffffffffff0,
                            (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
      bVar3 = false;
      if ((NVar2 == 0.0) && (!NAN(NVar2))) {
        uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x68));
        bVar3 = false;
        if (uVar1 == 1) {
          uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x68));
          bVar3 = false;
          if (uVar1 == 1) {
            NVar2 = NaMatrix::get((NaMatrix *)(ulong)in_stack_fffffffffffffff0,
                                  (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
            bVar3 = false;
            if ((NVar2 == 0.0) && (!NAN(NVar2))) {
              uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x80));
              bVar3 = false;
              if (uVar1 == 1) {
                uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x80));
                bVar3 = false;
                if (uVar1 == 1) {
                  NVar2 = NaMatrix::get((NaMatrix *)(ulong)in_stack_fffffffffffffff0,
                                        (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
                  bVar3 = false;
                  if ((NVar2 == 0.0) && (!NAN(NVar2))) {
                    uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x98));
                    bVar3 = false;
                    if (uVar1 == 1) {
                      uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x98));
                      bVar3 = false;
                      if (uVar1 == 1) {
                        NVar2 = NaMatrix::get((NaMatrix *)(ulong)in_stack_fffffffffffffff0,
                                              (uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
                        bVar3 = NVar2 == 0.0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool
NaStateSpaceModel::Empty () const
{
    return (1 == A.dim_rows() && 1 == A.dim_cols() && 0.0 == A.get(0, 0) &&
	    1 == B.dim_rows() && 1 == B.dim_cols() && 0.0 == B.get(0, 0) &&
	    1 == C.dim_rows() && 1 == C.dim_cols() && 0.0 == C.get(0, 0) &&
	    1 == D.dim_rows() && 1 == D.dim_cols() && 0.0 == D.get(0, 0));
}